

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  Rep *pRVar6;
  size_t sVar7;
  ulong uVar8;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *pRVar9;
  long lVar10;
  
  sVar5 = protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.uninterpreted_option_;
  pRVar9 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar6 = protobuf::internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar6->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar6 = protobuf::internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar6->elements;
  }
  lVar10 = sVar5 + (long)iVar1 * 2;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar9 != (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar9 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
               &(pRVar9->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = UninterpretedOption::ByteSizeLong
                      ((UninterpretedOption *)
                       (pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar10 = lVar10 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x18);
  sVar5 = (ulong)(uVar3 >> 10 & 2) + lVar10 +
          (ulong)(((((uVar3 & 0xbf000) >> 0xc) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c)
                 * 3);
  if ((char)uVar3 != '\0') {
    if ((uVar3 & 1) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.java_package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 2) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.java_outer_classname_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 4) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.go_package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 8) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.objc_class_prefix_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x10) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.csharp_namespace_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x20) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.swift_prefix_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x40) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.php_class_prefix_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((char)uVar3 < '\0') {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.php_namespace_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar3 & 0x700) != 0) {
    if ((uVar3 >> 8 & 1) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.php_metadata_namespace_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 >> 9 & 1) != 0) {
      lVar10 = *(long *)(((ulong)(this->field_0)._impl_.ruby_package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar10 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + lVar10 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 >> 10 & 1) != 0) {
      sVar7 = FeatureSet::ByteSizeLong((this->field_0)._impl_.features_);
      uVar4 = (uint)sVar7 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar7 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar3 >> 0x12 & 1) != 0) {
    uVar8 = (long)(this->field_0)._impl_.optimize_for_ | 1;
    lVar10 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar10 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t FileOptions::ByteSizeLong() const {
  const FileOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x000bf000u & cached_has_bits) * 3;
  total_size += static_cast<bool>(0x00000800u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional string java_package = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_java_package());
    }
    // optional string java_outer_classname = 8;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_java_outer_classname());
    }
    // optional string go_package = 11;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_go_package());
    }
    // optional string objc_class_prefix = 36;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_objc_class_prefix());
    }
    // optional string csharp_namespace = 37;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_csharp_namespace());
    }
    // optional string swift_prefix = 39;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_swift_prefix());
    }
    // optional string php_class_prefix = 40;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_class_prefix());
    }
    // optional string php_namespace = 41;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_namespace());
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    // optional string php_metadata_namespace = 44;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_php_metadata_namespace());
    }
    // optional string ruby_package = 45;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_ruby_package());
    }
    // optional .google.protobuf.FeatureSet features = 50;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
  }
   {
    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if ((cached_has_bits & 0x00040000u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optimize_for());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}